

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O0

MPP_RET jpege_gen_qt_by_qfactor(MppEncJpegCfg *cfg,RK_S32 *factor)

{
  uint uVar1;
  RK_U8 *pRVar2;
  short sVar3;
  short sVar4;
  RK_U8 RVar5;
  RK_U8 *pRVar6;
  RK_S16 cq;
  RK_S16 lq;
  RK_U8 *qtable_c;
  RK_U8 *qtable_y;
  RK_U32 i;
  RK_U32 qfactor;
  RK_U32 q;
  MPP_RET ret;
  RK_S32 *factor_local;
  MppEncJpegCfg *cfg_local;
  
  uVar1 = *factor;
  if (cfg->qtable_y == (RK_U8 *)0x0) {
    pRVar6 = (RK_U8 *)mpp_osal_malloc("jpege_gen_qt_by_qfactor",0x40);
    cfg->qtable_y = pRVar6;
  }
  if (cfg->qtable_u == (RK_U8 *)0x0) {
    pRVar6 = (RK_U8 *)mpp_osal_malloc("jpege_gen_qt_by_qfactor",0x40);
    cfg->qtable_u = pRVar6;
  }
  if ((cfg->qtable_y == (RK_U8 *)0x0) || (cfg->qtable_u == (RK_U8 *)0x0)) {
    _mpp_log_l(2,"jpege_api_v2","qtable is null, malloc err","jpege_gen_qt_by_qfactor");
    cfg_local._4_4_ = MPP_ERR_MALLOC;
  }
  else {
    pRVar6 = cfg->qtable_y;
    pRVar2 = cfg->qtable_u;
    if (uVar1 < 0x32) {
      i = (RK_U32)(5000 / (ulong)uVar1);
    }
    else {
      i = uVar1 * -2 + 200;
    }
    for (qtable_y._0_4_ = 0; (uint)qtable_y < 0x40; qtable_y._0_4_ = (uint)qtable_y + 1) {
      sVar3 = (short)((ulong)("\x10\v\n\x10\x18(3=\f\f\x0e\x13\x1a:<7\x0e\r\x10\x18(9E8\x0e\x11\x16\x1d3WP>\x12\x16%8DmgM\x18#7@Qhq\\1@NWgyxeH\\_bpdgc"
                              [(uint)qtable_y] * i + 0x32) / 100);
      sVar4 = (short)((ulong)("\x11\x12\x18/cccc\x12\x15\x1aBcccc\x18\x1a8ccccc/Bcccccccccccccccccccccccccccccccccccccc"
                              [(uint)qtable_y] * i + 0x32) / 100);
      if (sVar3 < 1) {
        RVar5 = '\x01';
      }
      else {
        if (0xff < sVar3) {
          sVar3 = 0xff;
        }
        RVar5 = (RK_U8)sVar3;
      }
      pRVar6[(uint)qtable_y] = RVar5;
      if (sVar4 < 1) {
        RVar5 = '\x01';
      }
      else {
        if (0xff < sVar4) {
          sVar4 = 0xff;
        }
        RVar5 = (RK_U8)sVar4;
      }
      pRVar2[(uint)qtable_y] = RVar5;
    }
    cfg_local._4_4_ = MPP_OK;
  }
  return cfg_local._4_4_;
}

Assistant:

static MPP_RET jpege_gen_qt_by_qfactor(MppEncJpegCfg *cfg, RK_S32 *factor)
{
    MPP_RET ret = MPP_OK;
    RK_U32 q, qfactor = *factor;
    RK_U32 i;
    RK_U8 *qtable_y = NULL;
    RK_U8 *qtable_c = NULL;

    if (!cfg->qtable_y)
        cfg->qtable_y = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);
    if (!cfg->qtable_u)
        cfg->qtable_u = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);

    if (NULL == cfg->qtable_y || NULL == cfg->qtable_u) {
        mpp_err_f("qtable is null, malloc err");
        return MPP_ERR_MALLOC;
    }
    qtable_y = cfg->qtable_y;
    qtable_c = cfg->qtable_u;

    if (qfactor < 50)
        q = 5000 / qfactor;
    else
        q = 200 - (qfactor << 1);

    for (i = 0; i < QUANTIZE_TABLE_SIZE; i++) {
        RK_S16 lq = (jpege_luma_quantizer[i] * q + 50) / 100;
        RK_S16 cq = (jpege_chroma_quantizer[i] * q + 50) / 100;

        /* Limit the quantizers to 1 <= q <= 255 */
        qtable_y[i] = MPP_CLIP3(1, 255, lq);
        qtable_c[i] = MPP_CLIP3(1, 255, cq);
    }

    return ret;
}